

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

void __thiscall
curlpp::OptionTrait<std::basic_ostream<char,_std::char_traits<char>_>_*,_(CURLoption)10001>::
~OptionTrait(OptionTrait<std::basic_ostream<char,_std::char_traits<char>_>_*,_(CURLoption)10001>
             *this)

{
  Option<std::basic_ostream<char,_std::char_traits<char>_>_*>::~Option
            (&this->super_Option<std::basic_ostream<char,_std::char_traits<char>_>_*>);
  operator_delete(this);
  return;
}

Assistant:

class CURLPPAPI OptionTrait : public Option<OptionType>
	{
		
		friend class Easy;

	public:

		static const CURLoption option = opt;

		/**
		* The constructor takes the a value to set a handle.
		*/
		OptionTrait(typename Option<OptionType>::ParamType value);

		/**
		* The constructor will contain an unset option value.
		* Note that if you try to retreive the value of this option
		* before calling the curlpp::Option::setValue function it will
		* throw a UnsetOption exception.
		*/
		OptionTrait();

		/**
		* Return a copy of the current option. 
		* Note that the option value is copied too.
		*/
		virtual OptionTrait * clone() const;

	private:

		/**
		* will call the actual libcurl option function with the value we got 
		* on the handle.
		*/
		virtual void updateHandleToMe(internal::CurlHandle * handle) const;

	}